

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::ParsedIR::set_member_name
          (ParsedIR *this,TypeID id,uint32_t index,string *name)

{
  ulong uVar1;
  bool bVar2;
  mapped_type *pmVar3;
  __hashtable *__h;
  ulong new_size;
  __node_gen_type __node_gen;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  uint32_t local_2c;
  
  local_38 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)CONCAT44(local_38._4_4_,id.id);
  pmVar3 = ::std::__detail::
           _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->meta,(key_type *)&local_38);
  uVar1 = (pmVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size;
  new_size = (ulong)index + 1;
  if (new_size < uVar1) {
    new_size = uVar1;
  }
  SmallVector<diligent_spirv_cross::Meta::Decoration,_0UL>::resize(&pmVar3->members,new_size);
  ::std::__cxx11::string::_M_assign
            ((string *)
             ((pmVar3->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr + index
             ));
  bVar2 = is_valid_identifier(name);
  if ((bVar2) && (bVar2 = is_reserved_identifier(name,true,false), !bVar2)) {
    return;
  }
  local_38 = &this->meta_needing_name_fixup;
  local_2c = id.id;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_38);
  return;
}

Assistant:

void ParsedIR::set_member_name(TypeID id, uint32_t index, const string &name)
{
	auto &m = meta[id];
	m.members.resize(max(m.members.size(), size_t(index) + 1));
	m.members[index].alias = name;
	if (!is_valid_identifier(name) || is_reserved_identifier(name, true, false))
		meta_needing_name_fixup.insert(id);
}